

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_3::
ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
::ConvertOne(ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
             *this,UnboundConversion *conv,string_view conv_string)

{
  bool bVar1;
  undefined1 local_48 [8];
  BoundConversion bound;
  UnboundConversion *conv_local;
  ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
  *this_local;
  string_view conv_string_local;
  
  bound.arg_ = (FormatArgImpl *)conv;
  BoundConversion::BoundConversion((BoundConversion *)local_48);
  bVar1 = ArgContext::Bind(&this->arg_context_,(UnboundConversion *)bound.arg_,
                           (BoundConversion *)local_48);
  if (bVar1) {
    conv_string_local._M_str._7_1_ =
         DefaultConverter::ConvertOne(&this->converter_,(BoundConversion *)local_48,conv_string);
  }
  else {
    conv_string_local._M_str._7_1_ = false;
  }
  return conv_string_local._M_str._7_1_;
}

Assistant:

bool ConvertOne(const UnboundConversion& conv, string_view conv_string) {
    BoundConversion bound;
    if (!arg_context_.Bind(&conv, &bound)) return false;
    return converter_.ConvertOne(bound, conv_string);
  }